

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

string * __thiscall
TgBot::TgTypeParser::parseChat_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  bool bVar1;
  element_type *peVar2;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_59;
  string local_58;
  undefined1 local_35;
  allocator local_21;
  __shared_ptr_access<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_20;
  Ptr *object_local;
  TgTypeParser *this_local;
  string *result;
  
  local_20 = (__shared_ptr_access<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)object;
  object_local = (Ptr *)this;
  this_local = (TgTypeParser *)__return_storage_ptr__;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)object);
  if (bVar1) {
    local_35 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'{');
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"id",&local_59);
    peVar2 = std::__shared_ptr_access<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson<long>(this,__return_storage_ptr__,&local_58,&peVar2->id);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    peVar2 = std::__shared_ptr_access<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    if (peVar2->type == Private) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,"type",&local_81);
      appendToJson<char[8]>(this,__return_storage_ptr__,&local_80,(char (*) [8])"private");
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    else {
      peVar2 = std::__shared_ptr_access<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_20);
      if (peVar2->type == Group) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_a8,"type",&local_a9);
        appendToJson<char[6]>(this,__return_storage_ptr__,&local_a8,(char (*) [6])0x4756f5);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      }
      else {
        peVar2 = std::__shared_ptr_access<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_20);
        if (peVar2->type == Supergroup) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_d0,"type",&local_d1);
          appendToJson<char[11]>(this,__return_storage_ptr__,&local_d0,(char (*) [11])"supergroup");
          std::__cxx11::string::~string((string *)&local_d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        }
        else {
          peVar2 = std::__shared_ptr_access<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(local_20);
          if (peVar2->type == Channel) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_f8,"type",&local_f9);
            appendToJson<char[8]>(this,__return_storage_ptr__,&local_f8,(char (*) [8])"channel");
            std::__cxx11::string::~string((string *)&local_f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_f9);
          }
        }
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"title",&local_121);
    peVar2 = std::__shared_ptr_access<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_120,&peVar2->title);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,"username",&local_149);
    peVar2 = std::__shared_ptr_access<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_148,&peVar2->username);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_170,"first_name",&local_171);
    peVar2 = std::__shared_ptr_access<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_170,&peVar2->firstName);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"last_name",&local_199);
    peVar2 = std::__shared_ptr_access<TgBot::Chat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    appendToJson(this,__return_storage_ptr__,&local_198,&peVar2->lastName);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    removeLastComma(this,__return_storage_ptr__);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'}');
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseChat(const Chat::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    appendToJson(result, "id", object->id);
    if (object->type == Chat::Type::Private) {
        appendToJson(result, "type", "private");
    } else if (object->type == Chat::Type::Group) {
        appendToJson(result, "type", "group");
    } else if (object->type == Chat::Type::Supergroup) {
        appendToJson(result, "type", "supergroup");
    } else if (object->type == Chat::Type::Channel) {
        appendToJson(result, "type", "channel");
    }
    appendToJson(result, "title", object->title);
    appendToJson(result, "username", object->username);
    appendToJson(result, "first_name", object->firstName);
    appendToJson(result, "last_name", object->lastName);
    removeLastComma(result);
    result += '}';
    return result;
}